

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8.cpp
# Opt level: O2

int utf8_ptr::s_compare_to(char *p1,size_t bytelen1,char *p2,size_t bytelen2)

{
  wchar_t wVar1;
  wchar_t wVar2;
  size_t sVar3;
  size_t sVar4;
  
  while( true ) {
    if ((bytelen1 == 0) || (bytelen2 == 0)) {
      return -(uint)(bytelen2 != 0) | (uint)(bytelen1 != 0);
    }
    wVar1 = s_getch(p1);
    wVar2 = s_getch(p2);
    if (wVar2 < wVar1) {
      return 1;
    }
    if (wVar1 < wVar2) break;
    sVar3 = s_charsize(*p1);
    sVar4 = s_charsize(*p2);
    bytelen1 = bytelen1 - sVar3;
    bytelen2 = bytelen2 - sVar4;
    p1 = p1 + sVar3;
    p2 = p2 + sVar4;
  }
  return -1;
}

Assistant:

int utf8_ptr::s_compare_to(const char *p1, size_t bytelen1,
                           const char *p2, size_t bytelen2)
{
    /* keep going until one or the other string runs out of bytes */
    while (bytelen1 != 0 && bytelen2 != 0)
    {
        wchar_t c1, c2;
        size_t siz1, siz2;
        
        /* get the current character from each string */
        c1 = s_getch(p1);
        c2 = s_getch(p2);

        /* compare them */
        if (c1 > c2)
            return 1;
        else if (c1 < c2)
            return -1;

        /* get the size of each character */
        siz1 = s_charsize(*p1);
        siz2 = s_charsize(*p2);

        /* decrement each counter by the byte size of this character */
        bytelen1 -= siz1;
        bytelen2 -= siz2;

        /* advance to the next character in each string */
        p1 += siz1;
        p2 += siz2;
    }

    /* 
     *   we didn't find any character differences, but one string is
     *   longer than the other -- if they ran out at the same time,
     *   they're identical; otherwise, the one that ran out first is the
     *   lesser one 
     */
    if (bytelen2 != 0)
    {
        /* the first one ran out first, so the first one sorts earlier */
        return -1;
    }
    else if (bytelen1 != 0)
    {
        /* the second one ran out first, so the first one sort later */
        return 1;
    }
    else
    {
        /* they both ran out at the same time */
        return 0;
    }
}